

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderStateQueryTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ShaderLogCase::iterate(ShaderLogCase *this)

{
  TestLog *pTVar1;
  ostringstream *this_00;
  int iVar2;
  ContextType type;
  GLSLVersion version;
  deUint32 type_00;
  GLuint shader;
  GLenum GVar3;
  undefined4 extraout_var;
  char *__s;
  undefined8 *puVar4;
  long *plVar5;
  ulong uVar6;
  long *plVar7;
  TestLog *pTVar8;
  ulong uVar9;
  undefined8 uVar10;
  StateQueryMemoryWriteGuard<int> logLen;
  CallLogWrapper gl;
  string source;
  char *brokenSource;
  ResultCollector result;
  string glslVersionDecl;
  long *local_2e0;
  undefined8 local_2d8;
  long local_2d0;
  undefined8 uStack_2c8;
  string local_2c0;
  ulong *local_2a0;
  long local_298;
  ulong local_290 [2];
  long *local_280;
  long local_278;
  long local_270;
  long lStack_268;
  StateQueryMemoryWriteGuard<int> local_25c;
  undefined1 local_250 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  long local_228 [2];
  long *local_218;
  code *local_210 [2];
  ResultCollector local_200;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  
  pTVar8 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pTVar1 = (TestLog *)(local_1b0 + 0x10);
  local_1b0._0_8_ = pTVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,0x96985f);
  tcu::ResultCollector::ResultCollector(&local_200,pTVar8,(string *)local_1b0);
  if ((TestLog *)local_1b0._0_8_ != pTVar1) {
    operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0[0]._M_allocated_capacity + 1));
  }
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)local_250,(Functions *)CONCAT44(extraout_var,iVar2),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  type.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  __s = glu::getGLSLVersionDeclaration(version);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b0,__s,(allocator<char> *)&local_280);
  local_238._M_allocated_capacity = (size_type)local_228;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_238,local_1b0._0_8_,(pointer)(local_1b0._0_8_ + local_1b0._8_8_));
  std::__cxx11::string::append(local_238._M_local_buf);
  if ((TestLog *)local_1b0._0_8_ != pTVar1) {
    operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0[0]._M_allocated_capacity + 1));
  }
  local_218 = (long *)local_238._M_allocated_capacity;
  local_25c.m_preguard = -0x21212122;
  local_25c.m_value = -0x21212122;
  local_25c.m_postguard = -0x21212122;
  local_250[0x10] = true;
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Trying to compile broken shader source.",0x27);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_138);
  type_00 = glu::getGLShaderType(this->m_shaderType);
  shader = glu::CallLogWrapper::glCreateShader((CallLogWrapper *)local_250,type_00);
  GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_250);
  if (GVar3 != 0) {
    local_2a0 = local_290;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"Got Error ","");
    local_210[0] = glu::getErrorName;
    local_210[1]._0_4_ = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2c0,local_210);
    uVar9 = 0xf;
    if (local_2a0 != local_290) {
      uVar9 = local_290[0];
    }
    if (uVar9 < local_2c0._M_string_length + local_298) {
      uVar10 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        uVar10 = local_2c0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar10 < local_2c0._M_string_length + local_298) goto LAB_004848ad;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2c0,0,(char *)0x0,(ulong)local_2a0);
    }
    else {
LAB_004848ad:
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2a0,(ulong)local_2c0._M_dataplus._M_p)
      ;
    }
    local_2e0 = &local_2d0;
    plVar5 = puVar4 + 2;
    if ((long *)*puVar4 == plVar5) {
      local_2d0 = *plVar5;
      uStack_2c8 = puVar4[3];
    }
    else {
      local_2d0 = *plVar5;
      local_2e0 = (long *)*puVar4;
    }
    local_2d8 = puVar4[1];
    *puVar4 = plVar5;
    puVar4[1] = 0;
    *(undefined1 *)plVar5 = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_2e0);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_270 = *plVar7;
      lStack_268 = plVar5[3];
      local_280 = &local_270;
    }
    else {
      local_270 = *plVar7;
      local_280 = (long *)*plVar5;
    }
    local_278 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_280);
    pTVar8 = (TestLog *)(plVar5 + 2);
    if ((TestLog *)*plVar5 == pTVar8) {
      local_1a0[0]._0_8_ = pTVar8->m_log;
      local_1a0[0]._8_8_ = plVar5[3];
      local_1b0._0_8_ = pTVar1;
    }
    else {
      local_1a0[0]._0_8_ = pTVar8->m_log;
      local_1b0._0_8_ = (TestLog *)*plVar5;
    }
    local_1b0._8_8_ = plVar5[1];
    *plVar5 = (long)pTVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    tcu::ResultCollector::fail(&local_200,(string *)local_1b0);
    if ((TestLog *)local_1b0._0_8_ != pTVar1) {
      operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0[0]._M_allocated_capacity + 1));
    }
    if (local_280 != &local_270) {
      operator_delete(local_280,local_270 + 1);
    }
    if (local_2e0 != &local_2d0) {
      operator_delete(local_2e0,local_2d0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
    if (local_2a0 != local_290) {
      operator_delete(local_2a0,local_290[0] + 1);
    }
  }
  glu::CallLogWrapper::glShaderSource
            ((CallLogWrapper *)local_250,shader,1,(GLchar **)&local_218,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader((CallLogWrapper *)local_250,shader);
  GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_250);
  if (GVar3 != 0) {
    local_2a0 = local_290;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"Got Error ","");
    local_210[0] = glu::getErrorName;
    local_210[1]._0_4_ = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2c0,local_210);
    uVar9 = 0xf;
    if (local_2a0 != local_290) {
      uVar9 = local_290[0];
    }
    if (uVar9 < local_2c0._M_string_length + local_298) {
      uVar10 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        uVar10 = local_2c0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar10 < local_2c0._M_string_length + local_298) goto LAB_00484b22;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2c0,0,(char *)0x0,(ulong)local_2a0);
    }
    else {
LAB_00484b22:
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2a0,(ulong)local_2c0._M_dataplus._M_p)
      ;
    }
    local_2e0 = &local_2d0;
    plVar5 = puVar4 + 2;
    if ((long *)*puVar4 == plVar5) {
      local_2d0 = *plVar5;
      uStack_2c8 = puVar4[3];
    }
    else {
      local_2d0 = *plVar5;
      local_2e0 = (long *)*puVar4;
    }
    local_2d8 = puVar4[1];
    *puVar4 = plVar5;
    puVar4[1] = 0;
    *(undefined1 *)plVar5 = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_2e0);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_270 = *plVar7;
      lStack_268 = plVar5[3];
      local_280 = &local_270;
    }
    else {
      local_270 = *plVar7;
      local_280 = (long *)*plVar5;
    }
    local_278 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_280);
    pTVar8 = (TestLog *)(plVar5 + 2);
    if ((TestLog *)*plVar5 == pTVar8) {
      local_1a0[0]._0_8_ = pTVar8->m_log;
      local_1a0[0]._8_8_ = plVar5[3];
      local_1b0._0_8_ = pTVar1;
    }
    else {
      local_1a0[0]._0_8_ = pTVar8->m_log;
      local_1b0._0_8_ = (TestLog *)*plVar5;
    }
    local_1b0._8_8_ = plVar5[1];
    *plVar5 = (long)pTVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    tcu::ResultCollector::fail(&local_200,(string *)local_1b0);
    if ((TestLog *)local_1b0._0_8_ != pTVar1) {
      operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0[0]._M_allocated_capacity + 1));
    }
    if (local_280 != &local_270) {
      operator_delete(local_280,local_270 + 1);
    }
    if (local_2e0 != &local_2d0) {
      operator_delete(local_2e0,local_2d0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
    if (local_2a0 != local_290) {
      operator_delete(local_2a0,local_290[0] + 1);
    }
  }
  glu::CallLogWrapper::glGetShaderiv((CallLogWrapper *)local_250,shader,0x8b84,&local_25c.m_value);
  gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity(&local_25c,&local_200);
  if ((char)local_25c.m_value == -0x22) {
    uVar9 = 0;
    do {
      uVar6 = uVar9;
      if (uVar6 == 3) goto LAB_00484d5b;
      uVar9 = uVar6 + 1;
    } while (*(char *)((long)&local_25c.m_value + uVar6 + 1) == -0x22);
    if (uVar6 < 3) goto LAB_00484d28;
  }
  else {
LAB_00484d28:
    verifyInfoLogQuery((Functional *)&local_200,(ResultCollector *)local_250,
                       (CallLogWrapper *)((ulong)local_25c._0_8_ >> 0x20),shader,0x86e370,0,
                       "glGetShaderInfoLog");
  }
LAB_00484d5b:
  glu::CallLogWrapper::glDeleteShader((CallLogWrapper *)local_250,shader);
  GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_250);
  if (GVar3 == 0) goto LAB_00484fb0;
  local_2a0 = local_290;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"Got Error ","");
  local_210[0] = glu::getErrorName;
  local_210[1]._0_4_ = GVar3;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_2c0,local_210);
  uVar9 = 0xf;
  if (local_2a0 != local_290) {
    uVar9 = local_290[0];
  }
  if (uVar9 < local_2c0._M_string_length + local_298) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      uVar10 = local_2c0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < local_2c0._M_string_length + local_298) goto LAB_00484e06;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_2c0,0,(char *)0x0,(ulong)local_2a0);
  }
  else {
LAB_00484e06:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2a0,(ulong)local_2c0._M_dataplus._M_p);
  }
  local_2e0 = &local_2d0;
  plVar5 = puVar4 + 2;
  if ((long *)*puVar4 == plVar5) {
    local_2d0 = *plVar5;
    uStack_2c8 = puVar4[3];
  }
  else {
    local_2d0 = *plVar5;
    local_2e0 = (long *)*puVar4;
  }
  local_2d8 = puVar4[1];
  *puVar4 = plVar5;
  puVar4[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2e0);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_270 = *plVar7;
    lStack_268 = plVar5[3];
    local_280 = &local_270;
  }
  else {
    local_270 = *plVar7;
    local_280 = (long *)*plVar5;
  }
  local_278 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_280);
  pTVar8 = (TestLog *)(plVar5 + 2);
  if ((TestLog *)*plVar5 == pTVar8) {
    local_1a0[0]._0_8_ = pTVar8->m_log;
    local_1a0[0]._8_8_ = plVar5[3];
    local_1b0._0_8_ = pTVar1;
  }
  else {
    local_1a0[0]._0_8_ = pTVar8->m_log;
    local_1b0._0_8_ = (TestLog *)*plVar5;
  }
  local_1b0._8_8_ = plVar5[1];
  *plVar5 = (long)pTVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  tcu::ResultCollector::fail(&local_200,(string *)local_1b0);
  if ((TestLog *)local_1b0._0_8_ != pTVar1) {
    operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0[0]._M_allocated_capacity + 1));
  }
  if (local_280 != &local_270) {
    operator_delete(local_280,local_270 + 1);
  }
  if (local_2e0 != &local_2d0) {
    operator_delete(local_2e0,local_2d0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  if (local_2a0 != local_290) {
    operator_delete(local_2a0,local_290[0] + 1);
  }
LAB_00484fb0:
  tcu::ResultCollector::setTestContextResult
            (&local_200,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  if ((long *)local_238._M_allocated_capacity != local_228) {
    operator_delete((void *)local_238._M_allocated_capacity,local_228[0] + 1);
  }
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200.m_message._M_dataplus._M_p != &local_200.m_message.field_2) {
    operator_delete(local_200.m_message._M_dataplus._M_p,
                    local_200.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200.m_prefix._M_dataplus._M_p != &local_200.m_prefix.field_2) {
    operator_delete(local_200.m_prefix._M_dataplus._M_p,
                    local_200.m_prefix.field_2._M_allocated_capacity + 1);
  }
  return STOP;
}

Assistant:

ShaderLogCase::IterateResult ShaderLogCase::iterate (void)
{
	using gls::StateQueryUtil::StateQueryMemoryWriteGuard;

	tcu::ResultCollector					result			(m_testCtx.getLog());
	glu::CallLogWrapper						gl				(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	deUint32								shader			= 0;
	const std::string						source			= brokenShaderSource(m_context.getRenderContext().getType());
	const char* const						brokenSource	= source.c_str();
	StateQueryMemoryWriteGuard<glw::GLint>	logLen;

	gl.enableLogging(true);

	m_testCtx.getLog() << tcu::TestLog::Message << "Trying to compile broken shader source." << tcu::TestLog::EndMessage;

	shader = gl.glCreateShader(glu::getGLShaderType(m_shaderType));
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "create shader");

	gl.glShaderSource(shader, 1, &brokenSource, DE_NULL);
	gl.glCompileShader(shader);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "compile");

	gl.glGetShaderiv(shader, GL_INFO_LOG_LENGTH, &logLen);
	logLen.verifyValidity(result);

	if (!logLen.isUndefined())
		verifyInfoLogQuery(result, gl, logLen, shader, &glu::CallLogWrapper::glGetShaderInfoLog, "glGetShaderInfoLog");

	gl.glDeleteShader(shader);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "delete");

	result.setTestContextResult(m_testCtx);
	return STOP;
}